

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::lookupPrefix
          (DOMNodeImpl *this,XMLCh *namespaceURI,DOMElement *originalElement)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  DOMNodeImpl *currentNode;
  int iVar5;
  undefined4 extraout_var;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  undefined4 extraout_var_01;
  DOMNodeImpl *pDVar9;
  long lVar10;
  DOMNodeImpl *pDVar11;
  undefined2 *puVar12;
  undefined4 extraout_var_04;
  undefined2 *puVar13;
  long lVar14;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  DOMNode *pDVar15;
  long *plVar16;
  DOMException *this_00;
  DOMNodeImpl *this_01;
  long lVar17;
  XMLCh *pXVar18;
  bool bVar19;
  XMLCh *pXVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_05;
  
  do {
    currentNode = (DOMNodeImpl *)this->fContainingNode;
    iVar5 = (*(code *)currentNode->fContainingNode[0x16]._vptr_DOMNode)(currentNode);
    pXVar6 = (XMLCh *)CONCAT44(extraout_var,iVar5);
    iVar5 = (*(code *)currentNode->fContainingNode[0x17]._vptr_DOMNode)(currentNode);
    pXVar7 = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
    if (pXVar6 != (XMLCh *)0x0) {
      if (pXVar6 == namespaceURI) {
        bVar19 = true;
      }
      else {
        pXVar8 = namespaceURI;
        pXVar18 = pXVar6;
        if (namespaceURI != (XMLCh *)0x0) {
          do {
            XVar3 = *pXVar6;
            pXVar18 = pXVar8;
            if (XVar3 == L'\0') goto LAB_0027257e;
            pXVar6 = pXVar6 + 1;
            XVar4 = *pXVar8;
            pXVar8 = pXVar8 + 1;
          } while (XVar3 == XVar4);
          goto LAB_002725f2;
        }
LAB_0027257e:
        bVar19 = *pXVar18 == L'\0';
      }
      if ((pXVar7 != (XMLCh *)0x0) && (bVar19)) {
        iVar5 = (*(originalElement->super_DOMNode)._vptr_DOMNode[0x25])(originalElement,pXVar7);
        pXVar6 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
        if (pXVar6 != (XMLCh *)0x0) {
          if (pXVar6 == namespaceURI) {
            return pXVar7;
          }
          if (namespaceURI == (XMLCh *)0x0) {
            XVar3 = *pXVar6;
joined_r0x002725db:
            if (XVar3 == L'\0') {
              return pXVar7;
            }
          }
          else {
            lVar10 = 0;
            do {
              psVar1 = (short *)((long)pXVar6 + lVar10);
              if (*psVar1 == 0) {
                XVar3 = *(XMLCh *)((long)namespaceURI + lVar10);
                goto joined_r0x002725db;
              }
              psVar2 = (short *)((long)namespaceURI + lVar10);
              lVar10 = lVar10 + 2;
            } while (*psVar1 == *psVar2);
          }
        }
      }
    }
LAB_002725f2:
    this_01 = currentNode;
    iVar5 = (*(code *)currentNode->fContainingNode[0x1a]._vptr_DOMNode)();
    if ((char)iVar5 != '\0') {
      this_01 = currentNode;
      iVar5 = (*(code *)currentNode->fContainingNode[0xb]._vptr_DOMNode)();
      pDVar9 = (DOMNodeImpl *)CONCAT44(extraout_var_02,iVar5);
      if ((pDVar9 != (DOMNodeImpl *)0x0) &&
         (this_01 = pDVar9, lVar10 = (*(code *)pDVar9->fContainingNode[5]._vptr_DOMNode)(),
         lVar10 != 0)) {
        lVar17 = 0;
        do {
          pDVar11 = (DOMNodeImpl *)
                    (*(code *)pDVar9->fContainingNode[3]._vptr_DOMNode)(pDVar9,lVar17);
          iVar5 = (*((DOMNode *)&pDVar11->fContainingNode)->_vptr_DOMNode[0x17])(pDVar11);
          puVar12 = (undefined2 *)CONCAT44(extraout_var_03,iVar5);
          iVar5 = (*((DOMNode *)&pDVar11->fContainingNode)->_vptr_DOMNode[3])(pDVar11);
          pXVar6 = (XMLCh *)CONCAT44(extraout_var_04,iVar5);
          this_01 = pDVar11;
          iVar5 = (*((DOMNode *)&pDVar11->fContainingNode)->_vptr_DOMNode[0x16])();
          puVar13 = (undefined2 *)CONCAT44(extraout_var_05,iVar5);
          if (puVar13 != (undefined2 *)0x0) {
            if (puVar13 == &XMLUni::fgXMLNSURIName) {
              bVar19 = true;
LAB_002726a9:
              if ((puVar12 != (undefined2 *)0x0) && (bVar19)) {
                if (puVar12 == &XMLUni::fgXMLNSString) {
LAB_002726fb:
                  if (pXVar6 != namespaceURI) {
                    pXVar7 = namespaceURI;
                    if ((namespaceURI != (XMLCh *)0x0) && (pXVar6 != (XMLCh *)0x0)) {
                      do {
                        XVar3 = *pXVar6;
                        if (XVar3 == L'\0') goto LAB_00272759;
                        pXVar6 = pXVar6 + 1;
                        XVar4 = *pXVar7;
                        pXVar7 = pXVar7 + 1;
                      } while (XVar3 == XVar4);
                      goto LAB_002727ca;
                    }
                    if (pXVar6 == (XMLCh *)0x0) {
                      if (namespaceURI == (XMLCh *)0x0) goto LAB_0027275f;
LAB_00272759:
                      XVar3 = *pXVar7;
                    }
                    else {
                      XVar3 = *pXVar6;
                      if ((namespaceURI != (XMLCh *)0x0) && (XVar3 == L'\0')) goto LAB_00272759;
                    }
                    if (XVar3 != L'\0') goto LAB_002727ca;
                  }
LAB_0027275f:
                  iVar5 = (*((DOMNode *)&pDVar11->fContainingNode)->_vptr_DOMNode[0x18])(pDVar11);
                  pXVar6 = (XMLCh *)CONCAT44(extraout_var_06,iVar5);
                  this_01 = (DOMNodeImpl *)originalElement;
                  iVar5 = (*(originalElement->super_DOMNode)._vptr_DOMNode[0x25])
                                    (originalElement,pXVar6);
                  pXVar7 = (XMLCh *)CONCAT44(extraout_var_07,iVar5);
                  if (pXVar7 != (XMLCh *)0x0) {
                    if (pXVar7 == namespaceURI) {
                      return pXVar6;
                    }
                    if (namespaceURI == (XMLCh *)0x0) {
                      XVar3 = *pXVar7;
joined_r0x002727ba:
                      if (XVar3 == L'\0') {
                        return pXVar6;
                      }
                    }
                    else {
                      lVar14 = 0;
                      do {
                        psVar1 = (short *)((long)pXVar7 + lVar14);
                        if (*psVar1 == 0) {
                          XVar3 = *(XMLCh *)((long)namespaceURI + lVar14);
                          goto joined_r0x002727ba;
                        }
                        psVar2 = (short *)((long)namespaceURI + lVar14);
                        lVar14 = lVar14 + 2;
                        this_01 = (DOMNodeImpl *)namespaceURI;
                      } while (*psVar1 == *psVar2);
                    }
                  }
                }
                else {
                  lVar14 = 0;
                  do {
                    psVar1 = (short *)((long)puVar12 + lVar14);
                    if (*psVar1 == 0) {
                      if (*(short *)((long)&XMLUni::fgXMLNSString + lVar14) == 0) goto LAB_002726fb;
                      break;
                    }
                    psVar2 = (short *)((long)&XMLUni::fgXMLNSString + lVar14);
                    lVar14 = lVar14 + 2;
                  } while (*psVar1 == *psVar2);
                }
              }
            }
            else {
              lVar14 = 0;
              do {
                psVar1 = (short *)((long)puVar13 + lVar14);
                if (*psVar1 == 0) {
                  bVar19 = *(short *)((long)&XMLUni::fgXMLNSURIName + lVar14) == 0;
                  goto LAB_002726a9;
                }
                psVar2 = (short *)((long)&XMLUni::fgXMLNSURIName + lVar14);
                lVar14 = lVar14 + 2;
              } while (*psVar1 == *psVar2);
            }
          }
LAB_002727ca:
          lVar17 = lVar17 + 1;
        } while (lVar17 != lVar10);
      }
    }
    pDVar15 = getElementAncestor(this_01,(DOMNode *)currentNode);
    if (pDVar15 == (DOMNode *)0x0) {
      return (XMLCh *)0x0;
    }
    plVar16 = (long *)__dynamic_cast(pDVar15,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo);
    if ((plVar16 == (long *)0x0) || (lVar10 = (**(code **)(*plVar16 + 0x10))(plVar16), lVar10 == 0))
    {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
      __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
    }
    this = (DOMNodeImpl *)(**(code **)(*plVar16 + 0x10))(plVar16);
  } while( true );
}

Assistant:

const XMLCh* DOMNodeImpl::lookupPrefix(const XMLCh* const namespaceURI, DOMElement *originalElement) const {
    const DOMNode *thisNode = getContainingNode();

    const XMLCh* ns = thisNode->getNamespaceURI();
    // REVISIT: if no prefix is available is it null or empty string, or
    //          could be both?
    const XMLCh* prefix = thisNode->getPrefix();

    if (ns != 0 && XMLString::equals(ns,namespaceURI) && prefix != 0) {
        const XMLCh* foundNamespace =  originalElement->lookupNamespaceURI(prefix);
        if (foundNamespace != 0 && XMLString::equals(foundNamespace, namespaceURI)) {
            return prefix;
        }
    }
    if (thisNode->hasAttributes()) {
        DOMNamedNodeMap *nodeMap = thisNode->getAttributes();

        if(nodeMap != 0) {
            XMLSize_t length = nodeMap->getLength();

            for (XMLSize_t i = 0;i < length;i++) {
                DOMNode *attr = nodeMap->item(i);
                const XMLCh* attrPrefix = attr->getPrefix();
                const XMLCh* value = attr->getNodeValue();

                ns = attr->getNamespaceURI();

                if (ns != 0 && XMLString::equals(ns, XMLUni::fgXMLNSURIName)) {
                    // DOM Level 2 nodes
                    if ((attrPrefix != 0 && XMLString::equals(attrPrefix, XMLUni::fgXMLNSString)) &&
                        XMLString::equals(value, namespaceURI)) {
                        const XMLCh* localname= attr->getLocalName();
                        const XMLCh* foundNamespace = originalElement->lookupNamespaceURI(localname);
                        if (foundNamespace != 0 && XMLString::equals(foundNamespace, namespaceURI)) {
                            return localname;
                        }
                    }
                }
            }
        }
    }
    DOMNode *ancestor = getElementAncestor(thisNode);
    if (ancestor != 0) {
        return castToNodeImpl(ancestor)->lookupPrefix(namespaceURI, originalElement);
    }
    return 0;
}